

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOutput.cpp
# Opt level: O0

void __thiscall TestOutput::printFailure(TestOutput *this,TestFailure *failure)

{
  bool bVar1;
  TestFailure *in_RSI;
  TestFailure *in_RDI;
  TestOutput *unaff_retaddr;
  TestFailure *in_stack_00000008;
  TestOutput *in_stack_00000010;
  SimpleString *in_stack_ffffffffffffffd8;
  TestOutput *in_stack_ffffffffffffffe0;
  
  bVar1 = TestFailure::isOutsideTestFile((TestFailure *)0x213b12);
  if (!bVar1) {
    bVar1 = TestFailure::isInHelperFunction(in_RSI);
    if (!bVar1) {
      printFileAndLineForFailure(unaff_retaddr,in_RDI);
      goto LAB_00213b46;
    }
  }
  printFileAndLineForTestAndFailure(in_stack_00000010,in_stack_00000008);
LAB_00213b46:
  (*in_RSI->_vptr_TestFailure[6])();
  printFailureMessage(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  SimpleString::~SimpleString((SimpleString *)0x213b77);
  return;
}

Assistant:

void TestOutput::printFailure(const TestFailure& failure)
{
    if (failure.isOutsideTestFile() || failure.isInHelperFunction())
        printFileAndLineForTestAndFailure(failure);
    else
        printFileAndLineForFailure(failure);

    printFailureMessage(failure.getMessage());
}